

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBroker_impl.hpp
# Opt level: O0

void __thiscall
helics::NetworkBroker<helics::zeromq::ZmqCommsSS,(gmlc::networking::InterfaceTypes)0,1>::
generateLocalAddressString_abi_cxx11_
          (NetworkBroker<helics::zeromq::ZmqCommsSS,(gmlc::networking::InterfaceTypes)0,1> *this)

{
  NetworkBroker<helics::zeromq::ZmqCommsSS,_(gmlc::networking::InterfaceTypes)0,_1>
  *in_stack_000000a8;
  
  generateLocalAddressString_abi_cxx11_(in_stack_000000a8);
  return;
}

Assistant:

std::string NetworkBroker<COMMS, baseline, tcode>::generateLocalAddressString() const
{
    using InterfaceTypes = gmlc::networking::InterfaceTypes;
    std::string add;
    if (CommsBroker<COMMS, CoreBroker>::comms->isConnected()) {
        add = CommsBroker<COMMS, CoreBroker>::comms->getAddress();
    } else {
        std::lock_guard<std::mutex> lock(dataMutex);
        switch (baseline) {
            case InterfaceTypes::TCP:
            case InterfaceTypes::IP:
            case InterfaceTypes::UDP:
                if (!netInfo.localInterface.empty() && (netInfo.localInterface.back() == '*')) {
                    add = gmlc::networking::makePortAddress(
                        netInfo.localInterface.substr(0, netInfo.localInterface.size() - 1),
                        netInfo.portNumber);
                } else {
                    add = gmlc::networking::makePortAddress(netInfo.localInterface,
                                                            netInfo.portNumber);
                }
                break;
            case InterfaceTypes::INPROC:
            case InterfaceTypes::IPC:
            default:
                if (!netInfo.localInterface.empty()) {
                    add = netInfo.localInterface;
                } else {
                    add = CoreBroker::getIdentifier();
                }
                break;
        }
    }
    return add;
}